

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::cond_and_expr(analysis *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar3;
  NodePtr ret;
  NodePtr tmp_ptr;
  NodePtr tmp_in_ptr;
  NodePtr tmp_cur_ptr;
  int local_cc;
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_a8;
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_88;
  const_iterator local_78;
  string local_70;
  string local_50;
  
  local_c8._M_ptr = (TreeNode *)0x0;
  local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  equality_expr((analysis *)&local_b8);
  token::getVal_abi_cxx11_
            (&local_a8,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar2 = std::operator==(&local_a8,"&&");
  std::__cxx11::string::~string((string *)&local_a8);
  _Var1._M_pi = local_b8._M_refcount._M_pi;
  if (bVar2) {
    local_88._M_ptr._0_4_ =
         token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    std::make_shared<dh::TreeNode,char_const(&)[3],int>((char (*) [3])&local_a8,(int *)"&&");
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_c8,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    std::__cxx11::string::string((string *)&local_70,"&&",(allocator *)&local_a8);
    match(in_RSI,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_a8._M_dataplus._M_p._0_4_ = 1;
    TreeNode::setNodeKind(local_c8._M_ptr,(int *)&local_a8);
    local_a8._M_dataplus._M_p._0_4_ = 2;
    TreeNode::setKind(local_c8._M_ptr,(int *)&local_a8);
    local_78._M_current = (token *)this;
    TreeNode::appendChild(local_c8._M_ptr,(NodePtr *)&local_b8);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_88,&local_c8);
    while( true ) {
      equality_expr((analysis *)&local_a8);
      std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_b8,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      token::getVal_abi_cxx11_
                (&local_a8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_a8,"&&");
      std::__cxx11::string::~string((string *)&local_a8);
      if (!bVar2) break;
      local_cc = token::getLineno((in_RSI->tmp).
                                  super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::make_shared<dh::TreeNode,char_const(&)[3],int>((char (*) [3])&local_a8,(int *)"&&");
      std::__cxx11::string::string((string *)&local_50,"&&",(allocator *)&local_cc);
      match(in_RSI,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      local_cc = 1;
      TreeNode::setNodeKind
                ((TreeNode *)
                 CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),&local_cc)
      ;
      local_cc = 2;
      TreeNode::setKind((TreeNode *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                        &local_cc);
      TreeNode::appendChild
                ((TreeNode *)
                 CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                 (NodePtr *)&local_b8);
      TreeNode::appendChild
                ((TreeNode *)CONCAT44(local_88._M_ptr._4_4_,(int)local_88._M_ptr),
                 (NodePtr *)&local_a8);
      std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_88,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    }
    TreeNode::appendChild
              ((TreeNode *)CONCAT44(local_88._M_ptr._4_4_,(int)local_88._M_ptr),(NodePtr *)&local_b8
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    _Var1._M_pi = local_c8._M_refcount._M_pi;
    local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((local_78._M_current)->_val)._M_dataplus._M_p = (pointer)local_c8._M_ptr;
    (((shared_ptr<dh::symTab> *)&((local_78._M_current)->_val)._M_string_length)->
    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)_Var1._M_pi
    ;
    local_c8._M_ptr = (TreeNode *)0x0;
    this = (analysis *)local_78._M_current;
  }
  else {
    local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this = local_b8._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    local_b8._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::cond_and_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in cond_and_expr\n";
#endif
	
	NodePtr ret;
	NodePtr tmp_ptr = equality_expr();

	if ( tmp->getVal() == "&&")
	{
		ret = ::std::make_shared<TreeNode>("&&",tmp->getLineno());
		match("&&");
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::CondAndK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = equality_expr();

			if ( tmp->getVal() == "&&")
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>("&&",tmp->getLineno());
				match("&&");
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::CondAndK);
				tmp_in_ptr->appendChild(tmp_ptr);

				tmp_cur_ptr->appendChild(tmp_in_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				tmp_cur_ptr->appendChild(tmp_ptr);
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}